

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_whitelist_sign
              (secp256k1_context *ctx,secp256k1_whitelist_signature *sig,
              secp256k1_pubkey *online_pubkeys,secp256k1_pubkey *offline_pubkeys,size_t n_keys,
              secp256k1_pubkey *sub_pubkey,uchar *online_seckey,uchar *summed_seckey,size_t index)

{
  uchar *e0;
  uchar *puVar1;
  size_t sVar2;
  size_t sVar3;
  uchar uVar4;
  uchar uVar5;
  int iVar6;
  secp256k1_scalar *r;
  uchar *nonce32;
  void *pvVar7;
  char *pcVar8;
  long lVar9;
  uint counter;
  int overflow_1;
  size_t local_a078;
  secp256k1_whitelist_signature *local_a070;
  uchar msg32 [32];
  size_t n_keys_local;
  secp256k1_scalar local_a018;
  secp256k1_scalar non;
  int overflow;
  uchar local_9fb8 [32];
  secp256k1_scalar s [255];
  secp256k1_gej pubs [255];
  
  sVar2 = index;
  n_keys_local = n_keys;
  if ((ctx->ecmult_gen_ctx).built == 0) {
    pvVar7 = (ctx->illegal_callback).data;
    pcVar8 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  else if (sig == (secp256k1_whitelist_signature *)0x0) {
    pvVar7 = (ctx->illegal_callback).data;
    pcVar8 = "sig != NULL";
  }
  else if (online_pubkeys == (secp256k1_pubkey *)0x0) {
    pvVar7 = (ctx->illegal_callback).data;
    pcVar8 = "online_pubkeys != NULL";
  }
  else if (offline_pubkeys == (secp256k1_pubkey *)0x0) {
    pvVar7 = (ctx->illegal_callback).data;
    pcVar8 = "offline_pubkeys != NULL";
  }
  else if (n_keys < 0x100) {
    if (sub_pubkey == (secp256k1_pubkey *)0x0) {
      pvVar7 = (ctx->illegal_callback).data;
      pcVar8 = "sub_pubkey != NULL";
    }
    else if (online_seckey == (uchar *)0x0) {
      pvVar7 = (ctx->illegal_callback).data;
      pcVar8 = "online_seckey != NULL";
    }
    else if (summed_seckey == (uchar *)0x0) {
      pvVar7 = (ctx->illegal_callback).data;
      pcVar8 = "summed_seckey != NULL";
    }
    else {
      if (index < n_keys) {
        local_a070 = sig;
        iVar6 = secp256k1_whitelist_compute_keys_and_message
                          (ctx,msg32,pubs,online_pubkeys,offline_pubkeys,(int)n_keys,sub_pubkey);
        if (iVar6 == 0) {
          return 0;
        }
        overflow = 0;
        local_a078 = n_keys;
        secp256k1_scalar_set_b32(&local_a018,summed_seckey,&overflow);
        if (overflow != 0) {
          return 0;
        }
        if ((local_a018.d[3] == 0 && local_a018.d[1] == 0) &&
            (local_a018.d[2] == 0 && local_a018.d[0] == 0)) {
          return 0;
        }
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,(secp256k1_gej *)s,&local_a018);
        iVar6 = secp256k1_whitelist_hash_pubkey(&non,(secp256k1_gej *)s);
        if (iVar6 == 0) {
          return 0;
        }
        secp256k1_scalar_mul(&local_a018,&local_a018,&non);
        secp256k1_scalar_set_b32(s,online_seckey,&overflow);
        if (overflow != 0) {
          return 0;
        }
        if ((s[0].d[3] == 0 && s[0].d[1] == 0) && (s[0].d[2] == 0 && s[0].d[0] == 0)) {
          return 0;
        }
        secp256k1_scalar_add(&local_a018,&local_a018,s);
        overflow_1 = 0;
        secp256k1_scalar_get_b32((uchar *)&overflow,&local_a018);
        uVar5 = msg32[1];
        uVar4 = msg32[0];
        sVar3 = local_a078;
        e0 = local_a070->data;
        puVar1 = local_a070->data;
        counter = 0;
        do {
          nonce_function_rfc6979
                    (local_9fb8,msg32,(uchar *)&overflow,(uchar *)0x0,(void *)0x0,counter);
          secp256k1_scalar_set_b32(&non,local_9fb8,&overflow_1);
          if ((overflow_1 == 0) &&
             ((non.d[3] != 0 || non.d[1] != 0) || (non.d[2] != 0 || non.d[0] != 0))) {
            r = s;
            lVar9 = 1;
            nonce32 = puVar1;
            do {
              nonce32 = nonce32 + 0x20;
              if (lVar9 - sVar3 == 1) {
                local_a070->n_keys = local_a078;
                iVar6 = secp256k1_borromean_sign
                                  (&ctx->ecmult_gen_ctx,e0,s,pubs,&non,&local_a018,&n_keys_local,
                                   &index,1,msg32,0x20);
                secp256k1_scalar_get_b32(e0 + sVar2 * 0x20 + 0x20,s + sVar2);
                return iVar6;
              }
              msg32[0] = uVar4 ^ (byte)lVar9;
              msg32[1] = (byte)((ulong)lVar9 >> 8) ^ uVar5;
              nonce_function_rfc6979
                        (nonce32,msg32,(uchar *)&overflow,(uchar *)0x0,(void *)0x0,counter);
              secp256k1_scalar_set_b32(r,nonce32,&overflow_1);
              if (overflow_1 != 0) break;
              iVar6 = secp256k1_scalar_is_zero(r);
              lVar9 = lVar9 + 1;
              r = r + 1;
            } while (iVar6 == 0);
          }
          counter = counter + 1;
        } while( true );
      }
      pvVar7 = (ctx->illegal_callback).data;
      pcVar8 = "index < n_keys";
    }
  }
  else {
    pvVar7 = (ctx->illegal_callback).data;
    pcVar8 = "n_keys <= MAX_KEYS";
  }
  (*(ctx->illegal_callback).fn)(pcVar8,pvVar7);
  return 0;
}

Assistant:

int secp256k1_whitelist_sign(const secp256k1_context* ctx, secp256k1_whitelist_signature *sig, const secp256k1_pubkey *online_pubkeys, const secp256k1_pubkey *offline_pubkeys, const size_t n_keys, const secp256k1_pubkey *sub_pubkey, const unsigned char *online_seckey, const unsigned char *summed_seckey, const size_t index) {
    secp256k1_gej pubs[MAX_KEYS];
    secp256k1_scalar s[MAX_KEYS];
    secp256k1_scalar sec, non;
    unsigned char msg32[32];
    int ret;

    /* Sanity checks */
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig != NULL);
    ARG_CHECK(online_pubkeys != NULL);
    ARG_CHECK(offline_pubkeys != NULL);
    ARG_CHECK(n_keys <= MAX_KEYS);
    ARG_CHECK(sub_pubkey != NULL);
    ARG_CHECK(online_seckey != NULL);
    ARG_CHECK(summed_seckey != NULL);
    ARG_CHECK(index < n_keys);

    /* Compute pubkeys: online_pubkey + tweaked(offline_pubkey + address), and message */
    ret = secp256k1_whitelist_compute_keys_and_message(ctx, msg32, pubs, online_pubkeys, offline_pubkeys, n_keys, sub_pubkey);

    /* Compute signing key: online_seckey + tweaked(summed_seckey) */
    if (ret) {
        ret = secp256k1_whitelist_compute_tweaked_privkey(ctx, &sec, online_seckey, summed_seckey);
    }
    /* Compute nonce and random s-values */
    if (ret) {
        unsigned char seckey32[32];
        unsigned int count = 0;
        int overflow = 0;

        secp256k1_scalar_get_b32(seckey32, &sec);
        while (1) {
            size_t i;
            unsigned char nonce32[32];
            int done;
            ret = secp256k1_nonce_function_default(nonce32, msg32, seckey32, NULL, NULL, count);
            if (!ret) {
                break;
            }
            secp256k1_scalar_set_b32(&non, nonce32, &overflow);
            memset(nonce32, 0, 32);
            if (overflow || secp256k1_scalar_is_zero(&non)) {
                count++;
                continue;
            }
            done = 1;
            for (i = 0; i < n_keys; i++) {
                msg32[0] ^= i + 1;
                msg32[1] ^= (i + 1) / 0x100;
                ret = secp256k1_nonce_function_default(&sig->data[32 * (i + 1)], msg32, seckey32, NULL, NULL, count);
                if (!ret) {
                    break;
                }
                secp256k1_scalar_set_b32(&s[i], &sig->data[32 * (i + 1)], &overflow);
                msg32[0] ^= i + 1;
                msg32[1] ^= (i + 1) / 0x100;
                if (overflow || secp256k1_scalar_is_zero(&s[i])) {
                    count++;
                    done = 0;
                    break;
                }
            }
            if (done) {
                break;
            }
        }
        memset(seckey32, 0, 32);
    }
    /* Actually sign */
    if (ret) {
        sig->n_keys = n_keys;
        ret = secp256k1_borromean_sign(&ctx->ecmult_gen_ctx, &sig->data[0], s, pubs, &non, &sec, &n_keys, &index, 1, msg32, 32);
        /* Signing will change s[index], so update in the sig structure */
        secp256k1_scalar_get_b32(&sig->data[32 * (index + 1)], &s[index]);
    }

    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    return ret;
}